

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  size_type sVar1;
  real *prVar2;
  reference pvVar3;
  iterator iVar4;
  iterator __last;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  int in_ESI;
  _func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *in_RDI;
  Vector *in_R8;
  double dVar5;
  int32_t i;
  value_type *in_stack_ffffffffffffff88;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffb8;
  Model *in_stack_ffffffffffffffc0;
  int local_2c;
  
  computeOutputSoftmax
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Vector *)in_stack_ffffffffffffffb0._M_current);
  local_2c = 0;
  do {
    if (*(int *)(in_RDI + 0x68) <= local_2c) {
      return;
    }
    sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                      (in_RDX);
    if (sVar1 == (long)in_ESI) {
      prVar2 = Vector::operator[](in_R8,(long)local_2c);
      dVar5 = utils::log((double)(ulong)(uint)*prVar2);
      pvVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                         (in_stack_ffffffffffffff90);
      if (pvVar3->first <= SUB84(dVar5,0)) goto LAB_00148770;
    }
    else {
LAB_00148770:
      in_stack_ffffffffffffff90 = in_RDX;
      prVar2 = Vector::operator[](in_R8,(long)local_2c);
      utils::log((double)(ulong)(uint)*prVar2);
      std::make_pair<float,int&>(&in_stack_ffffffffffffff88->first,(int *)0x1487a7);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      iVar4 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_stack_ffffffffffffff88);
      __last = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          in_stack_ffffffffffffff88);
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar4._M_current,
                 (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__last._M_current,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)
                 in_stack_ffffffffffffffb0._M_current);
      sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        (in_RDX);
      if ((ulong)(long)in_ESI < sVar1) {
        in_stack_ffffffffffffffb0 =
             std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        in_stack_ffffffffffffff88);
        iVar4 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                          ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *
                           )in_stack_ffffffffffffff88);
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )in_stack_ffffffffffffffb0._M_current,
                   (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )iVar4._M_current,in_RDI);
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x148841);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Model::findKBest(int32_t k, std::vector<std::pair<real, int32_t>>& heap,
                      Vector& hidden, Vector& output) const {
  computeOutputSoftmax(hidden, output);
  for (int32_t i = 0; i < osz_; i++) {
    if (heap.size() == k && utils::log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(utils::log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}